

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::StructElement::~StructElement(StructElement *this)

{
  StructElement *this_local;
  
  ~StructElement(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

StructElement() = delete;